

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_parser.hpp
# Opt level: O1

void __thiscall
chaiscript::parser::
ChaiScript_Parser<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>,_chaiscript::optimizer::Optimizer<chaiscript::optimizer::Partial_Fold,_chaiscript::optimizer::Unused_Return,_chaiscript::optimizer::Constant_Fold,_chaiscript::optimizer::If,_chaiscript::optimizer::Return,_chaiscript::optimizer::Dead_Code,_chaiscript::optimizer::Block,_chaiscript::optimizer::For_Loop,_chaiscript::optimizer::Assign_Decl>,_512UL>
::IntSuffix_(ChaiScript_Parser<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>,_chaiscript::optimizer::Optimizer<chaiscript::optimizer::Partial_Fold,_chaiscript::optimizer::Unused_Return,_chaiscript::optimizer::Constant_Fold,_chaiscript::optimizer::If,_chaiscript::optimizer::Return,_chaiscript::optimizer::Dead_Code,_chaiscript::optimizer::Block,_chaiscript::optimizer::For_Loop,_chaiscript::optimizer::Assign_Decl>,_512UL>
             *this)

{
  byte *pbVar1;
  
  pbVar1 = (byte *)(this->m_position).m_pos;
  if (pbVar1 != (byte *)(this->m_position).m_end) {
    do {
      if (m_alphabet._M_elems[10]._M_elems[*pbVar1] != true) {
        return;
      }
      Position::operator++(&this->m_position);
      pbVar1 = (byte *)(this->m_position).m_pos;
    } while (pbVar1 != (byte *)(this->m_position).m_end);
  }
  return;
}

Assistant:

constexpr bool has_more() const noexcept { return m_pos != m_end; }